

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O2

void __thiscall SemanticTypes::visit(SemanticTypes *this,SwitchNode *switchNode)

{
  CaseBlockNode *pCVar1;
  ExpNode *pEVar2;
  
  pEVar2 = switchNode->exp;
  if (pEVar2 == (ExpNode *)0x0) {
    fprintf(_stderr,"[SEMANTIC ERROR - switchNode] NO VALID CONDITION, line: %d\n",
            (ulong)(uint)(switchNode->super_StmtNode).super_ASTNode.line);
  }
  else {
    (*(pEVar2->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar2,this);
    pEVar2 = switchNode->exp;
    if (pEVar2->type != 0xb) {
      fprintf(_stderr,"[SEMANTIC ERROR - switchNode] CONDITION MUST BE INT, line: %d\n",
              (ulong)(uint)(switchNode->super_StmtNode).super_ASTNode.line);
      pEVar2 = switchNode->exp;
    }
    (*(switchNode->super_StmtNode).super_ASTNode._vptr_ASTNode[2])
              (switchNode,(ulong)(uint)(pEVar2->super_StmtNode).super_ASTNode.line);
  }
  pCVar1 = switchNode->block;
  if (pCVar1 != (CaseBlockNode *)0x0) {
    breakDepth = breakDepth + 1;
    (*(pCVar1->super_ASTNode)._vptr_ASTNode[3])(pCVar1,this);
    breakDepth = breakDepth + -1;
    return;
  }
  fprintf(_stderr,"[SEMANTIC ERROR - switchNode] CASE STATEMENT REQUIRED, line: %d\n",
          (ulong)(uint)(switchNode->super_StmtNode).super_ASTNode.line);
  return;
}

Assistant:

void SemanticTypes::visit(SwitchNode *switchNode) {

    if (switchNode->getExp() != NULL) {
        switchNode->getExp()->accept(this);
        if (switchNode->getExp()->getType() != INT) {
            fprintf(stderr, "[SEMANTIC ERROR - switchNode] CONDITION MUST BE INT, line: %d\n", switchNode->getLine());
        }

        switchNode->setLine(switchNode->getExp()->getLine());
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - switchNode] NO VALID CONDITION, line: %d\n", switchNode->getLine());
    }
    if (switchNode->getBlock() != NULL) {
        breakDepth += 1;
        switchNode->getBlock()->accept(this);
        breakDepth -= 1;
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - switchNode] CASE STATEMENT REQUIRED, line: %d\n", switchNode->getLine());
    }
}